

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

bool __thiscall bssl::Vector<TagAndArray>::Push(Vector<TagAndArray> *this,TagAndArray *elem)

{
  bool bVar1;
  TagAndArray *elem_local;
  Vector<TagAndArray> *this_local;
  
  bVar1 = MaybeGrow(this);
  if (bVar1) {
    anon_unknown_0::VectorTest_VectorContainingVectors_Test::TestBody::TagAndArray::TagAndArray
              (this->data_ + this->size_,elem);
    this->size_ = this->size_ + 1;
  }
  return bVar1;
}

Assistant:

[[nodiscard]] bool Push(T elem) {
    if (!MaybeGrow()) {
      return false;
    }
    new (&data_[size_]) T(std::move(elem));
    size_++;
    return true;
  }